

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

result_type __thiscall
math::wide_integer::uniform_int_distribution<24u,unsigned_char,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<24u,unsigned_char,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  bool bVar1;
  enable_if_t<(_false),_uintwide_t<24U,_unsigned_char>_> eVar2;
  uintwide_t<24U,_unsigned_char,_void,_false> uVar3;
  array<unsigned_char,_3UL> aVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  result_type result;
  result_type range;
  array<unsigned_char,_3UL> local_34;
  uintwide_t<24U,_unsigned_char,_void,_false> local_30;
  uintwide_t<24U,_unsigned_char,_void,_false> local_2c;
  uintwide_t<24U,_unsigned_char,_void,_false> local_28;
  uintwide_t<24U,_unsigned_char,_void,_false> local_24;
  
  bVar7 = 0;
  uintwide_t<24u,unsigned_char,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
  enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std::
  numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_char>::digits),void>::type__
            (&local_34,'\0',
             (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  lVar6 = 0;
  uVar5 = 0;
  do {
    if (lVar6 == 0) {
      uVar5 = std::linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::operator()
                        (input_generator);
    }
    else if (lVar6 == 3) {
      local_28.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
           *(undefined2 *)(input_params->param_a).values.super_array<unsigned_char,_3UL>.elems;
      local_28.values.super_array<unsigned_char,_3UL>.elems[2] =
           (input_params->param_a).values.super_array<unsigned_char,_3UL>.elems[2];
      eVar2 = uintwide_t<24U,_unsigned_char,_void,_false>::limits_helper_min<false>();
      local_30.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
           eVar2.values.super_array<unsigned_char,_3UL>.elems._0_2_;
      local_30.values.super_array<unsigned_char,_3UL>.elems[2] =
           eVar2.values.super_array<unsigned_char,_3UL>.elems[2];
      bVar1 = uintwide_t<24U,_unsigned_char,_void,_false>::operator!=(&local_28,&local_30);
      if (!bVar1) {
        local_2c.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
             *(undefined2 *)(input_params->param_b).values.super_array<unsigned_char,_3UL>.elems;
        local_2c.values.super_array<unsigned_char,_3UL>.elems[2] =
             (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[2];
        eVar2 = uintwide_t<24U,_unsigned_char,_void,_false>::limits_helper_max<false>();
        local_24.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
             eVar2.values.super_array<unsigned_char,_3UL>.elems._0_2_;
        local_24.values.super_array<unsigned_char,_3UL>.elems[2] =
             eVar2.values.super_array<unsigned_char,_3UL>.elems[2];
        bVar1 = uintwide_t<24U,_unsigned_char,_void,_false>::operator!=(&local_2c,&local_24);
        if (!bVar1) {
          aVar4.elems[0] = local_34.elems[0];
          aVar4.elems[1] = local_34.elems[1];
          aVar4.elems[2] = local_34.elems[2];
          return (result_type)aVar4.elems;
        }
      }
      local_30.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
           *(undefined2 *)(input_params->param_b).values.super_array<unsigned_char,_3UL>.elems;
      local_30.values.super_array<unsigned_char,_3UL>.elems[2] =
           (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[2];
      local_2c.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
           *(undefined2 *)(input_params->param_a).values.super_array<unsigned_char,_3UL>.elems;
      local_2c.values.super_array<unsigned_char,_3UL>.elems[2] =
           (input_params->param_a).values.super_array<unsigned_char,_3UL>.elems[2];
      uVar3 = wide_integer::operator-(&local_30,&local_2c);
      local_28.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
           uVar3.values.super_array<unsigned_char,_3UL>.elems._0_2_;
      local_28.values.super_array<unsigned_char,_3UL>.elems[2] =
           uVar3.values.super_array<unsigned_char,_3UL>.elems[2];
      uintwide_t<24U,_unsigned_char,_void,_false>::preincrement(&local_28);
      uintwide_t<24U,_unsigned_char,_void,_false>::operator%=
                ((uintwide_t<24U,_unsigned_char,_void,_false> *)&local_34,&local_28);
      local_30.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
           *(undefined2 *)(input_params->param_a).values.super_array<unsigned_char,_3UL>.elems;
      local_30.values.super_array<unsigned_char,_3UL>.elems[2] =
           (input_params->param_a).values.super_array<unsigned_char,_3UL>.elems[2];
      uintwide_t<24U,_unsigned_char,_void,_false>::operator+=
                ((uintwide_t<24U,_unsigned_char,_void,_false> *)&local_34,&local_30);
      return (representation_type)(representation_type)local_34.elems;
    }
    local_34.elems[lVar6] = local_34.elems[lVar6] | (byte)(uVar5 >> (bVar7 & 0x1f));
    lVar6 = lVar6 + 1;
    bVar7 = bVar7 + 8;
  } while( true );
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }